

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardrtn.c
# Opt level: O1

void incusecount68k(FX *fx68k)

{
  DLword *pDVar1;
  ushort uVar2;
  byte bVar3;
  ulong uVar4;
  
  if ((fx68k != (FX *)0x0) && ((FX *)Stackspace != fx68k)) {
    bVar3 = (char)*(undefined2 *)&fx68k->field_0x2 + 1;
    fx68k->field_0x2 = bVar3;
    if (200 < bVar3) {
      error("MP9324:Stack frame use count maximum exceeded");
    }
    pDVar1 = Stackspace + fx68k->nextblock;
    uVar2 = *(ushort *)((ulong)pDVar1 ^ 2) >> 0xd;
    if (uVar2 == 4) {
      if (((*(ushort *)((ulong)(pDVar1 + 2) ^ 2) & 0xe000) == 0xc000) && ((pDVar1[2] & 1) == 0)) {
        uVar4 = (long)pDVar1 - (long)Stackspace >> 1;
        if (0xffff < uVar4) {
          printf("Stack offset is out of range: 0x%tx\n",uVar4);
        }
        pDVar1[0xb] = (DLword)uVar4;
        pDVar1[10] = pDVar1[2];
        *(byte *)(pDVar1 + 2) = (byte)pDVar1[2] | 1;
      }
    }
    else if (uVar2 == 0) {
      do {
      } while( true );
    }
  }
  return;
}

Assistant:

void incusecount68k(FX *fx68k) {
  StackWord *scanptr68k;

  if (FX_INVALIDP(fx68k)) return;

  CHECK_FX(fx68k);

  if ((++(fx68k->usecount)) > MAXSAFEUSECOUNT)
    error("MP9324:Stack frame use count maximum exceeded");

  scanptr68k = (StackWord *)NativeAligned2FromStackOffset(fx68k->nextblock);
  switch (STKWORD(scanptr68k)->flags) {
    case STK_NOTFLG:
      while (STKWORD(scanptr68k)->flags != STK_BF)
        scanptr68k = (StackWord *)(((DLword *)scanptr68k) + DLWORDSPER_CELL);
      break;

    case STK_BF: break;

    default:
      return;
      /* break; */
  } /* switch end */

  /* DEBUG */
  S_CHECK(
      (((Bframe *)scanptr68k)->residual == T) || (((Bframe *)scanptr68k)->ivar == fx68k->nextblock),
      "BF not residual, and IVER /= nextblock of prior frame");

  scanptr68k = (StackWord *)(((DLword *)scanptr68k) + DLWORDSPER_CELL);

  if (STKWORD(scanptr68k)->flags == STK_FX) {
    CHECK_FX((FX *)scanptr68k);
    SET_FASTP_NIL(scanptr68k);
  }

}